

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O3

uint32_t __thiscall ArchiveMemberHeader::getSize(ArchiveMemberHeader *this)

{
  int iVar1;
  size_type *__nptr;
  void *pvVar2;
  int *piVar3;
  ulong uVar4;
  Fatal local_1d8;
  size_type *local_50;
  string sizeString;
  
  pvVar2 = memchr(this->size,0x20,10);
  local_50 = &sizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,this->size,pvVar2);
  __nptr = local_50;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtoll((char *)__nptr,(char **)&local_1d8,10);
  if ((size_type *)local_1d8._0_8_ == __nptr) {
    std::__throw_invalid_argument("stoll");
  }
  else {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    else if (*piVar3 == 0x22) {
      std::__throw_out_of_range("stoll");
    }
    if (uVar4 < 0xffffffff) {
      if (local_50 != &sizeString._M_string_length) {
        operator_delete(local_50,sizeString._M_string_length + 1);
      }
      return (uint32_t)uVar4;
    }
  }
  ::wasm::Fatal::Fatal(&local_1d8);
  ::wasm::Fatal::operator<<(&local_1d8,(char (*) [40])"Malformed archive: size parsing failed\n");
  ::wasm::Fatal::~Fatal(&local_1d8);
}

Assistant:

uint32_t ArchiveMemberHeader::getSize() const {
  auto* end = static_cast<const char*>(memchr(size, ' ', sizeof(size)));
  std::string sizeString((const char*)size, end);
  auto sizeInt = std::stoll(sizeString, nullptr, 10);
  if (sizeInt < 0 || sizeInt >= std::numeric_limits<uint32_t>::max()) {
    wasm::Fatal() << "Malformed archive: size parsing failed\n";
  }
  return static_cast<uint32_t>(sizeInt);
}